

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O2

void display_map(int *cy,int *cx)

{
  monster_race *pmVar1;
  void *pvVar2;
  loc lVar3;
  int iVar4;
  wchar_t wVar5;
  long lVar6;
  byte bVar7;
  wchar_t wVar8;
  int iVar9;
  chunk_conflict *pcVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  wchar_t tc;
  wchar_t local_ac;
  wchar_t ta;
  wchar_t local_a4;
  void *local_a0;
  wchar_t local_94;
  ulong local_90;
  long local_88;
  monster_race *local_80;
  wchar_t *local_78;
  wchar_t *local_70;
  ulong local_68;
  wchar_t map_wid;
  wchar_t map_hgt;
  grid_data g;
  
  pmVar1 = r_info;
  local_78 = cy;
  local_70 = cx;
  local_a0 = mem_zalloc((long)cave->height << 3);
  lVar6 = 0;
  while( true ) {
    uVar14 = (ulong)cave->height;
    if ((long)uVar14 <= lVar6) break;
    pvVar2 = mem_zalloc((long)cave->width);
    *(void **)((long)local_a0 + lVar6 * 8) = pvVar2;
    lVar6 = lVar6 + 1;
  }
  get_minimap_dimensions
            ((term_conflict *)Term,(chunk *)cave,(uint)tile_width,(uint)tile_height,&map_wid,
             &map_hgt);
  uVar12 = (ulong)(uint)map_wid;
  local_90 = (ulong)(uint)map_hgt;
  if (map_hgt < L'\x01' || map_wid < L'\x01') {
    for (lVar6 = 0; lVar6 < (int)uVar14; lVar6 = lVar6 + 1) {
      mem_free(*(void **)((long)local_a0 + lVar6 * 8));
      uVar14 = (ulong)(uint)cave->height;
    }
    mem_free(local_a0);
    return;
  }
  local_80 = pmVar1;
  ta = L'\x01';
  tc = L' ';
  wVar5 = map_hgt + L'\x01';
  wVar8 = L'\0';
  local_ac = tc;
  local_a4 = ta;
  window_make(L'\0',L'\0',map_wid + L'\x01',wVar5);
  if (map_wid + L'\x01' < Term->wid + L'\xffffffff') {
    for (; wVar5 != wVar8; wVar8 = wVar8 + L'\x01') {
      Term_erase(map_wid + L'\x02',wVar8,(Term->wid - map_wid) + L'\xfffffffe');
    }
  }
  wVar8 = Term->hgt;
  if (wVar5 < wVar8 + L'\xffffffff') {
    for (wVar5 = (int)local_90 + L'\x02'; wVar5 < wVar8; wVar5 = wVar5 + L'\x01') {
      Term_erase(L'\0',wVar5,Term->wid);
      wVar8 = Term->hgt;
    }
  }
  pcVar10 = cave;
  local_68 = uVar12;
  for (iVar9 = 0; iVar4 = pcVar10->height, iVar9 < iVar4; iVar9 = iVar9 + 1) {
    uVar14 = (long)(iVar9 * (int)local_90) / (long)iVar4;
    iVar4 = (int)uVar14;
    if (1 < tile_height) {
      iVar4 = iVar4 - (int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) %
                           (long)(int)(uint)tile_height);
    }
    local_88 = (long)iVar4;
    local_94 = iVar4 + L'\x01';
    iVar13 = 0;
    for (iVar4 = 0; iVar4 < pcVar10->width; iVar4 = iVar4 + 1) {
      uVar14 = (long)iVar13 / (long)pcVar10->width;
      iVar11 = (int)uVar14;
      if (1 < tile_width) {
        iVar11 = iVar11 - (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar14 & 0xffffffff)
                               % (long)(int)(uint)tile_width);
      }
      lVar3 = (loc)loc(iVar4,iVar9);
      map_info(lVar3,&g);
      grid_data_as_text(&g,&local_a4,&local_ac,&ta,&tc);
      if ((local_a4 == ta) && (local_ac == tc)) {
        bVar7 = f_info[g.f_idx].priority;
      }
      else {
        bVar7 = 0x14;
      }
      if (*(byte *)(*(long *)((long)local_a0 + local_88 * 8) + (long)iVar11) < bVar7) {
        g.lighting = LIGHTING_LIT;
        grid_data_as_text(&g,&local_a4,&local_ac,&ta,&tc);
        Term_queue_char(Term,iVar11 + L'\x01',local_94,local_a4,local_ac,ta,tc);
        if ((1 < tile_width) || (1 < tile_height)) {
          Term_big_queue_char(Term,iVar11 + L'\x01',local_94,Term->hgt + L'\xffffffff',L'ÿ',
                              L'\xffffffff',L'\0',L'\0');
        }
        *(byte *)(*(long *)((long)local_a0 + local_88 * 8) + (long)iVar11) = bVar7;
      }
      iVar13 = iVar13 + (int)local_68;
      pcVar10 = cave;
      uVar12 = local_68;
    }
  }
  uVar14 = (long)((player->grid).y * (int)local_90) / (long)iVar4;
  iVar9 = (int)uVar14;
  uVar12 = (long)((int)uVar12 * (player->grid).x) / (long)pcVar10->width;
  iVar4 = (int)uVar12;
  if (1 < tile_width) {
    iVar4 = iVar4 - (int)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) %
                         (long)(int)(uint)tile_width);
  }
  if (1 < tile_height) {
    iVar9 = iVar9 - (int)((long)((ulong)(uint)(iVar9 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) %
                         (long)(int)(uint)tile_height);
  }
  lVar3.x = (player->grid).x;
  lVar3.y = (player->grid).y;
  map_info(lVar3,&g);
  g.lighting = LIGHTING_LIT;
  grid_data_as_text(&g,&local_a4,&local_ac,&ta,&tc);
  wVar8 = iVar4 + L'\x01';
  wVar5 = iVar9 + L'\x01';
  Term_queue_char(Term,wVar8,wVar5,(uint)monster_x_attr[local_80->ridx],
                  monster_x_char[local_80->ridx],ta,tc);
  if ((1 < tile_width) || (1 < tile_height)) {
    Term_big_queue_char(Term,wVar8,wVar5,Term->hgt + L'\xffffffff',L'ÿ',L'\xffffffff',L'\0',L'\0');
  }
  if (local_78 != (wchar_t *)0x0) {
    *local_78 = wVar5;
  }
  if (local_70 != (wchar_t *)0x0) {
    *local_70 = wVar8;
  }
  for (lVar6 = 0; lVar6 < cave->height; lVar6 = lVar6 + 1) {
    mem_free(*(void **)((long)local_a0 + lVar6 * 8));
  }
  mem_free(local_a0);
  return;
}

Assistant:

void display_map(int *cy, int *cx)
{
	int map_hgt, map_wid;
	int row, col;

	int x, y;
	struct grid_data g;

	int a, ta;
	wchar_t c, tc;

	uint8_t tp;

	struct monster_race *race = &r_info[0];

	/* Priority array */
	uint8_t **mp = mem_zalloc(cave->height * sizeof(uint8_t*));
	for (y = 0; y < cave->height; y++)
		mp[y] = mem_zalloc(cave->width * sizeof(uint8_t));

	/* Desired map height */
	get_minimap_dimensions(Term, cave, tile_width, tile_height,
		&map_wid, &map_hgt);

	/* Prevent accidents */
	if ((map_wid < 1) || (map_hgt < 1)) {
		for (y = 0; y < cave->height; y++)
			mem_free(mp[y]);
		mem_free(mp);
		return;
	}

	/* Nothing here */
	a = COLOUR_WHITE;
    c = L' ';
	ta = COLOUR_WHITE;
	tc = L' ';

	/* Draw a box around the edge of the term */
	window_make(0, 0, map_wid + 1, map_hgt + 1);

	/* Clear outside that boundary. */
	if (map_wid + 1 < Term->wid - 1) {
		for (y = 0; y < map_hgt + 1; y++) {
			Term_erase(map_wid + 2, y, Term->wid - map_wid - 2);
		}
	}
	if (map_hgt + 1 < Term->hgt - 1) {
		for (y = map_hgt + 2; y < Term->hgt; y++) {
			Term_erase(0, y, Term->wid);
		}
	}

	/* Analyze the actual map */
	for (y = 0; y < cave->height; y++) {
		row = (y * map_hgt) / cave->height;
		if (tile_height > 1) row = row - (row % tile_height);

		for (x = 0; x < cave->width; x++) {
			col = (x * map_wid) / cave->width;
			if (tile_width > 1) col = col - (col % tile_width);

			/* Get the attr/char at that map location */
			map_info(loc(x, y), &g);
			grid_data_as_text(&g, &a, &c, &ta, &tc);

			/* Get the priority of that attr/char */
			tp = f_info[g.f_idx].priority;

			/* Stuff on top of terrain gets higher priority */
			if ((a != ta) || (c != tc)) tp = 20;

			/* Save "best" */
			if (mp[row][col] < tp) {
				/* Hack - make every grid on the map lit */
				g.lighting = LIGHTING_LIT;
				grid_data_as_text(&g, &a, &c, &ta, &tc);

				Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

				if ((tile_width > 1) || (tile_height > 1))
					Term_big_queue_char(Term, col + 1,
						row + 1, Term->hgt - 1,
						255, -1, 0, 0);

				/* Save priority */
				mp[row][col] = tp;
			}
		}
	}

	/*** Display the player ***/

	/* Player location */
	row = (player->grid.y * map_hgt / cave->height);
	col = (player->grid.x * map_wid / cave->width);

	if (tile_width > 1)
		col = col - (col % tile_width);
	if (tile_height > 1)
		row = row - (row % tile_height);

	/* Get the terrain at the player's spot. */
	map_info(player->grid, &g);
	g.lighting = LIGHTING_LIT;
	grid_data_as_text(&g, &a, &c, &ta, &tc);

	/* Get the "player" tile */
	a = monster_x_attr[race->ridx];
	c = monster_x_char[race->ridx];

	/* Draw the player */
	Term_queue_char(Term, col + 1, row + 1, a, c, ta, tc);

	if ((tile_width > 1) || (tile_height > 1))
		Term_big_queue_char(Term, col + 1, row + 1, Term->hgt - 1,
			255, -1, 0, 0);
  
	/* Return player location */
	if (cy != NULL) (*cy) = row + 1;
	if (cx != NULL) (*cx) = col + 1;

	for (y = 0; y < cave->height; y++)
		mem_free(mp[y]);
	mem_free(mp);
}